

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int jas_stream_close(jas_stream_t *stream)

{
  int iVar1;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("jas_stream_close(%p)\n",stream);
  }
  if ((stream->bufmode_ & 0x10) == 0) {
    jas_stream_flushbuf(stream,-1);
  }
  (*stream->ops_->close_)(stream->obj_);
  jas_stream_destroy(stream);
  return 0;
}

Assistant:

int jas_stream_close(jas_stream_t *stream)
{
	JAS_DBGLOG(100, ("jas_stream_close(%p)\n", stream));

	/* Flush buffer if necessary. */
	jas_stream_flush(stream);

	/* Close the underlying stream object. */
	(*stream->ops_->close_)(stream->obj_);

	jas_stream_destroy(stream);

	return 0;
}